

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginPopupEx(ImGuiID id,ImGuiWindowFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ulong uVar3;
  char *fmt;
  char name [20];
  char acStack_38 [32];
  
  pIVar1 = GImGui;
  uVar3 = (ulong)id;
  bVar2 = IsPopupOpen(id,0);
  if (bVar2) {
    if (((uint)flags >> 0x1c & 1) == 0) {
      fmt = "##Popup_%08x";
    }
    else {
      uVar3 = (ulong)(uint)(pIVar1->BeginPopupStack).Size;
      fmt = "##Menu_%02d";
    }
    ImFormatString(acStack_38,0x14,fmt,uVar3);
    bVar2 = Begin(acStack_38,(bool *)0x0,flags | 0x4200000);
    if (!bVar2) {
      EndPopup();
    }
  }
  else {
    (pIVar1->NextWindowData).Flags = 0;
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::BeginPopupEx(ImGuiID id, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    char name[20];
    if (flags & ImGuiWindowFlags_ChildMenu)
        ImFormatString(name, IM_ARRAYSIZE(name), "##Menu_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth
    else
        ImFormatString(name, IM_ARRAYSIZE(name), "##Popup_%08x", id); // Not recycling, so we can close/open during the same frame

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoDocking;
    bool is_open = Begin(name, NULL, flags);
    if (!is_open) // NB: Begin can return false when the popup is completely clipped (e.g. zero size display)
        EndPopup();

    return is_open;
}